

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_math.cpp
# Opt level: O0

double getCorrelationCoefficient3d(TRIPLERGB **mrx,int h,int w,int component,int y,int x)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  __type _Var4;
  double dVar5;
  undefined4 local_68;
  undefined4 local_64;
  int j;
  int i;
  double countSqr2;
  double countSqr1;
  double count2;
  double count1;
  double count;
  double Exp2;
  double Exp1;
  int x_local;
  int y_local;
  int component_local;
  int w_local;
  int h_local;
  TRIPLERGB **mrx_local;
  
  if (y < 0) {
    iVar3 = y;
    if (y < 1) {
      iVar3 = -y;
    }
    Exp2 = getExpection(mrx,h,w - x,component,iVar3,0);
    iVar3 = y;
    if (y < 1) {
      iVar3 = -y;
    }
    count = getExpection(mrx,h - iVar3,w,component,0,x);
  }
  else {
    Exp2 = getExpection(mrx,h - y,w - x,component,0,0);
    count = getExpection(mrx,h,w,component,y,x);
  }
  count1 = 0.0;
  countSqr2 = 0.0;
  _j = 0.0;
  local_64 = 0;
  while( true ) {
    iVar3 = y;
    if (y < 1) {
      iVar3 = -y;
    }
    if (h - iVar3 <= local_64) break;
    for (local_68 = 0; local_68 < w - x; local_68 = local_68 + 1) {
      if (y < 0) {
        iVar3 = y;
        if (y < 1) {
          iVar3 = -y;
        }
        bVar1 = getComponent((TRIPLEBYTES **)mrx,iVar3 + local_64,local_68,component);
        bVar2 = getComponent((TRIPLEBYTES **)mrx,local_64,x + local_68,component);
      }
      else {
        bVar1 = getComponent((TRIPLEBYTES **)mrx,local_64,local_68,component);
        bVar2 = getComponent((TRIPLEBYTES **)mrx,y + local_64,x + local_68,component);
      }
      count2 = (double)bVar1 - Exp2;
      countSqr1 = (double)bVar2 - count;
      count1 = count2 * countSqr1 + count1;
      _Var4 = std::pow<double,int>(count2,2);
      countSqr2 = _Var4 + countSqr2;
      _Var4 = std::pow<double,int>(countSqr1,2);
      _j = _Var4 + _j;
    }
    local_64 = local_64 + 1;
  }
  dVar5 = sqrt(countSqr2 * _j);
  return count1 / dVar5;
}

Assistant:

double getCorrelationCoefficient3d(TRIPLERGB **mrx, int h, int w, int component, int y, int x) {
    double Exp1;
    double Exp2;
    if (y < 0) {
        Exp1 = getExpection(mrx, h, w - x, component, abs(y), 0);
        Exp2 = getExpection(mrx, h - abs(y), w, component, 0, x);
    } else {
        Exp1 = getExpection(mrx, h - y, w - x, component);
        Exp2 = getExpection(mrx, h, w, component, y, x);
    }
    double count = 0;
    double count1 = 0;
    double count2 = 0;
    double countSqr1 = 0;
    double countSqr2 = 0;
    for (int i = 0; i < h - abs(y); i++) {
        for (int j = 0; j < w - x; j++) {
            if (y < 0) {
                count1 = (double) getComponent((TRIPLEBYTES **) mrx, abs(y) + i, j, component) - Exp1;
                count2 = (double) getComponent((TRIPLEBYTES **) mrx, i, x + j, component) - Exp2;
            } else {
                count1 = (double) getComponent((TRIPLEBYTES **) mrx, i, j, component) - Exp1;
                count2 = (double) getComponent((TRIPLEBYTES **) mrx, y + i, x + j, component) - Exp2;
            }
            count += count1 * count2;
            countSqr1 += pow(count1, 2);
            countSqr2 += pow(count2, 2);
        }
    }
    return count / sqrt(countSqr1 * countSqr2);
}